

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContext::InternalTryBindRelation
          (ClientContext *this,Relation *relation,
          vector<duckdb::ColumnDefinition,_true> *result_columns)

{
  type pBVar1;
  reference __args;
  reference __args_1;
  idx_t i;
  ulong __n;
  shared_ptr<duckdb::Binder,_true> binder;
  BoundStatement result;
  undefined1 local_70 [24];
  vector<duckdb::LogicalType,_true> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_40;
  
  Binder::CreateBinder
            ((Binder *)local_70,this,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  pBVar1 = shared_ptr<duckdb::Binder,_true>::operator*((shared_ptr<duckdb::Binder,_true> *)local_70)
  ;
  (*relation->_vptr_Relation[4])(local_70 + 0x10,relation,pBVar1);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::reserve
            (&result_columns->
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>,
             ((long)local_40.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_40.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) +
             ((long)(result_columns->
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ).
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(result_columns->
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ).
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
  for (__n = 0; __n < (ulong)((long)local_40.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_40.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&local_40,__n);
    __args_1 = vector<duckdb::LogicalType,_true>::get<true>(&local_58,__n);
    ::std::vector<duckdb::ColumnDefinition,std::allocator<duckdb::ColumnDefinition>>::
    emplace_back<std::__cxx11::string&,duckdb::LogicalType&>
              ((vector<duckdb::ColumnDefinition,std::allocator<duckdb::ColumnDefinition>> *)
               result_columns,__args,__args_1);
  }
  BoundStatement::~BoundStatement((BoundStatement *)(local_70 + 0x10));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  return;
}

Assistant:

void ClientContext::InternalTryBindRelation(Relation &relation, vector<ColumnDefinition> &result_columns) {
	// bind the expressions
	auto binder = Binder::CreateBinder(*this);
	auto result = relation.Bind(*binder);
	D_ASSERT(result.names.size() == result.types.size());

	result_columns.reserve(result_columns.size() + result.names.size());
	for (idx_t i = 0; i < result.names.size(); i++) {
		result_columns.emplace_back(result.names[i], result.types[i]);
	}
}